

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sym_tbl.cpp
# Opt level: O0

bool __thiscall
mocker::SymTbl::addSymbol
          (SymTbl *this,ScopeID *scopeID,string *identifier,
          shared_ptr<mocker::ast::Declaration> *decl)

{
  bool bVar1;
  element_type *peVar2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>,_true>
  local_60 [3];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>,_true>
  local_48;
  undefined1 local_40 [8];
  shared_ptr<mocker::SymTbl::Scope> scope;
  shared_ptr<mocker::ast::Declaration> *decl_local;
  string *identifier_local;
  ScopeID *scopeID_local;
  SymTbl *this_local;
  
  scope.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)decl;
  getScope((SymTbl *)local_40,(ScopeID *)this);
  peVar2 = std::__shared_ptr_access<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>_>_>
       ::find(&peVar2->syms,identifier);
  peVar2 = std::__shared_ptr_access<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
  local_60[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>_>_>
       ::end(&peVar2->syms);
  bVar1 = std::__detail::operator!=(&local_48,local_60);
  if (!bVar1) {
    peVar2 = std::
             __shared_ptr_access<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
    std::
    unordered_map<std::__cxx11::string,std::shared_ptr<mocker::ast::Declaration>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<mocker::ast::Declaration>>>>
    ::emplace<std::__cxx11::string_const&,std::shared_ptr<mocker::ast::Declaration>>
              ((unordered_map<std::__cxx11::string,std::shared_ptr<mocker::ast::Declaration>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<mocker::ast::Declaration>>>>
                *)peVar2,identifier,decl);
  }
  this_local._7_1_ = !bVar1;
  std::shared_ptr<mocker::SymTbl::Scope>::~shared_ptr((shared_ptr<mocker::SymTbl::Scope> *)local_40)
  ;
  return this_local._7_1_;
}

Assistant:

bool SymTbl::addSymbol(const ScopeID &scopeID, const std::string &identifier,
                       std::shared_ptr<ast::Declaration> decl) {
  auto scope = getScope(scopeID);
  if (scope->syms.find(identifier) != scope->syms.end())
    return false;
  scope->syms.emplace(identifier, std::move(decl));
  return true;
}